

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

MovePack * pyramid_movePackGet(Board *board)

{
  byte bVar1;
  code *pcVar2;
  int iVar3;
  Spot *pSVar4;
  Board *in_RDI;
  uchar tableauCardRank;
  uchar y;
  uchar j;
  uchar i;
  Spot *spot;
  uchar tableauCardRanks [28];
  uchar wasteCardRank;
  Spot *waste;
  uchar stockCardRank;
  Spot *stock;
  MovePack *movePack;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff3c;
  MovePack *in_stack_ffffffffffffff40;
  uchar toSpotIndex;
  undefined8 in_stack_ffffffffffffff48;
  SPOTTYPE toSpotType;
  int in_stack_ffffffffffffff50;
  uchar fromSpotIndex;
  SPOTTYPE fromSpotType;
  undefined4 in_stack_ffffffffffffff54;
  MOVETYPE type;
  undefined8 in_stack_ffffffffffffff58;
  MovePack *in_stack_ffffffffffffff60;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  byte local_52;
  byte local_51;
  byte abStack_48 [31];
  byte local_29;
  Spot *local_28;
  byte local_19;
  Spot *local_18;
  MovePack *local_10;
  Board *local_8;
  
  local_8 = in_RDI;
  local_10 = movePack_create();
  local_18 = board_spotGet(local_8,STOCK,'\0');
  if (local_18->cardsCount == '\0') {
    local_19 = 0;
  }
  else {
    if (SBORROW4((uint)local_18->cardsCount,1)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    local_19 = local_18->cards[(int)(local_18->cardsCount - 1)]->rank;
  }
  local_28 = board_spotGet(local_8,WASTE,'\0');
  if (local_28->cardsCount == '\0') {
    local_29 = 0;
  }
  else {
    if (SBORROW4((uint)local_28->cardsCount,1)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    local_29 = local_28->cards[(int)(local_28->cardsCount - 1)]->rank;
  }
  for (local_51 = 0; local_51 < 0x1c; local_51 = local_51 + 1) {
    pSVar4 = board_spotGet(local_8,TABLEAU,local_51);
    if (pSVar4->cardsCount == '\x01') {
      abStack_48[local_51] = (*pSVar4->cards)->rank;
    }
    else {
      abStack_48[local_51] = 0;
    }
  }
  local_51 = 0;
  do {
    if (0x14 < local_51) {
      if (local_19 == 0xd) {
        uVar5 = 0xffffffff;
        move_create((MOVETYPE)((uint)in_stack_ffffffffffffff54 >> 0x18),
                    (SPOTTYPE)((uint)in_stack_ffffffffffffff54 >> 0x10),
                    (uchar)((uint)in_stack_ffffffffffffff54 >> 8),in_stack_ffffffffffffff50,
                    (SPOTTYPE)((ulong)in_stack_ffffffffffffff48 >> 0x38),
                    (uchar)((ulong)in_stack_ffffffffffffff48 >> 0x30),(int)in_stack_ffffffffffffff60
                   );
        movePack_add(in_stack_ffffffffffffff40,(Move *)CONCAT44(in_stack_ffffffffffffff3c,uVar5));
      }
      if (local_29 == 0xd) {
        uVar5 = 0xffffffff;
        move_create((MOVETYPE)((uint)in_stack_ffffffffffffff54 >> 0x18),
                    (SPOTTYPE)((uint)in_stack_ffffffffffffff54 >> 0x10),
                    (uchar)((uint)in_stack_ffffffffffffff54 >> 8),in_stack_ffffffffffffff50,
                    (SPOTTYPE)((ulong)in_stack_ffffffffffffff48 >> 0x38),
                    (uchar)((ulong)in_stack_ffffffffffffff48 >> 0x30),(int)in_stack_ffffffffffffff60
                   );
        movePack_add(in_stack_ffffffffffffff40,(Move *)CONCAT44(in_stack_ffffffffffffff3c,uVar5));
      }
      if (((local_19 != 0) && (local_29 != 0)) && ((uint)local_19 + (uint)local_29 == 0xd)) {
        pyramid_addCombineMove
                  (in_stack_ffffffffffffff60,(SPOTTYPE)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                   (uchar)((ulong)in_stack_ffffffffffffff58 >> 0x30),
                   (SPOTTYPE)((ulong)in_stack_ffffffffffffff58 >> 0x28),
                   (uchar)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      }
      local_51 = 0;
      while( true ) {
        toSpotIndex = (uchar)((ulong)in_stack_ffffffffffffff48 >> 0x30);
        toSpotType = (SPOTTYPE)((ulong)in_stack_ffffffffffffff48 >> 0x38);
        fromSpotIndex = (uchar)((uint)in_stack_ffffffffffffff54 >> 8);
        fromSpotType = (SPOTTYPE)((uint)in_stack_ffffffffffffff54 >> 0x10);
        type = (MOVETYPE)((uint)in_stack_ffffffffffffff54 >> 0x18);
        if (0x1b < local_51) break;
        if (abStack_48[local_51] != 0) {
          bVar1 = abStack_48[local_51];
          if (bVar1 == 0xd) {
            uVar5 = 0xffffffff;
            in_stack_ffffffffffffff60 = local_10;
            move_create(type,fromSpotType,fromSpotIndex,in_stack_ffffffffffffff50,toSpotType,
                        toSpotIndex,(int)local_10);
            movePack_add(in_stack_ffffffffffffff40,(Move *)CONCAT44(in_stack_ffffffffffffff3c,uVar5)
                        );
          }
          if ((local_19 != 0) && ((uint)local_19 + (uint)bVar1 == 0xd)) {
            pyramid_addCombineMove
                      (in_stack_ffffffffffffff60,
                       (SPOTTYPE)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                       (uchar)((ulong)in_stack_ffffffffffffff58 >> 0x30),
                       (SPOTTYPE)((ulong)in_stack_ffffffffffffff58 >> 0x28),
                       (uchar)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          }
          if ((local_29 != 0) && ((uint)local_29 + (uint)bVar1 == 0xd)) {
            pyramid_addCombineMove
                      (in_stack_ffffffffffffff60,
                       (SPOTTYPE)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                       (uchar)((ulong)in_stack_ffffffffffffff58 >> 0x30),
                       (SPOTTYPE)((ulong)in_stack_ffffffffffffff58 >> 0x28),
                       (uchar)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          }
          for (local_52 = 0; local_52 < 0x1c; local_52 = local_52 + 1) {
            if (((local_51 != local_52) && (abStack_48[local_52] != 0)) &&
               ((uint)bVar1 + (uint)abStack_48[local_52] == 0xd)) {
              pyramid_addCombineMove
                        (in_stack_ffffffffffffff60,
                         (SPOTTYPE)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                         (uchar)((ulong)in_stack_ffffffffffffff58 >> 0x30),
                         (SPOTTYPE)((ulong)in_stack_ffffffffffffff58 >> 0x28),
                         (uchar)((ulong)in_stack_ffffffffffffff58 >> 0x20));
            }
          }
        }
        local_51 = local_51 + 1;
      }
      if (local_19 != 0) {
        uVar5 = 0xffffffff;
        move_create(type,fromSpotType,fromSpotIndex,in_stack_ffffffffffffff50,toSpotType,toSpotIndex
                    ,(int)in_stack_ffffffffffffff60);
        movePack_add(in_stack_ffffffffffffff40,(Move *)CONCAT44(in_stack_ffffffffffffff3c,uVar5));
      }
      if ((((gConfig.game)->id == PYRAMIDEASY) || ((gConfig.game)->id == PYRAMIDRELAXEDEASY)) &&
         ((local_29 != 0 && ((local_19 == 0 && (*local_8->gameState < 2)))))) {
        iVar3 = *local_8->gameState + 1;
        if (SCARRY4((uint)*local_8->gameState,1)) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(char *)local_8->gameState = (char)iVar3;
        uVar5 = 0xffffffff;
        move_create(MOVE,SPOT_NA,(uchar)((uint)iVar3 >> 8),in_stack_ffffffffffffff50,
                    (SPOTTYPE)((ulong)local_10 >> 0x38),(uchar)((ulong)local_10 >> 0x30),
                    (int)in_stack_ffffffffffffff60);
        movePack_add(in_stack_ffffffffffffff40,(Move *)CONCAT44(in_stack_ffffffffffffff3c,uVar5));
      }
      return local_10;
    }
    if (abStack_48[local_51] != 0) {
      if (local_51 == 0) {
        local_78 = 1;
      }
      else {
        if (local_51 < 3) {
          local_7c = 2;
        }
        else {
          if (local_51 < 6) {
            local_80 = 3;
          }
          else {
            if (local_51 < 10) {
              local_84 = 4;
            }
            else {
              local_84 = 6;
              if (local_51 < 0xf) {
                local_84 = 5;
              }
            }
            local_80 = local_84;
          }
          local_7c = local_80;
        }
        local_78 = local_7c;
      }
      if (abStack_48[(int)((uint)local_51 + local_78)] == 0) {
        if (SCARRY4((uint)local_51 + local_78,1)) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        if (abStack_48[(int)((uint)local_51 + local_78 + 1)] == 0) goto LAB_00106c25;
      }
      abStack_48[local_51] = 0;
    }
LAB_00106c25:
    local_51 = local_51 + 1;
  } while( true );
}

Assistant:

MovePack * pyramid_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	Spot * stock = board_spotGet(board, STOCK, 0);
	unsigned char stockCardRank = stock->cardsCount>0 ? stock->cards[stock->cardsCount-1]->rank : 0;
	Spot * waste = board_spotGet(board, WASTE, 0);
	unsigned char wasteCardRank = waste->cardsCount>0 ? waste->cards[waste->cardsCount-1]->rank : 0;
	unsigned char tableauCardRanks[28];
	Spot * spot;
	unsigned char i, j, y, tableauCardRank;

	// Get our tableau cards
	for(i=0;i<28;i++)
	{
		spot = board_spotGet(board, TABLEAU, i);
		if(spot->cardsCount==1)
			tableauCardRanks[i] = spot->cards[0]->rank;
		else
			tableauCardRanks[i] = 0;
	}

	// Remove those that are covered up by others
	for(i=0;i<=20;i++)
	{
		if(tableauCardRanks[i]==0)
			continue;

		y = (i==0 ? 1 : (i<=2 ? 2 : (i<=5 ? 3 : (i<=9 ? 4 : (i<=14 ? 5 : 6)))));

		if(tableauCardRanks[i+y]!=0 || tableauCardRanks[i+y+1]!=0)
		{
			tableauCardRanks[i] = 0;
			continue;
		}
	}

	// Stock or Waste Kings
	if(stockCardRank==13)
		movePack_add(movePack, move_create(MOVE, STOCK, 0, -1, FOUNDATION, 0, -1));
	if(wasteCardRank==13)
		movePack_add(movePack, move_create(MOVE, WASTE, 0, -1, FOUNDATION, 0, -1));

	// Waste+Stock
	if(stockCardRank!=0 && wasteCardRank!=0 && stockCardRank+wasteCardRank==13)
		pyramid_addCombineMove(movePack, STOCK, 0, WASTE, 0);

	// Tableau
	for(i=0;i<28;i++)
	{
		if(tableauCardRanks[i]==0)
			continue;

		tableauCardRank = tableauCardRanks[i];

		// Tableau King
		if(tableauCardRank==13)
			movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, 0, -1));

		// Stock+Tableau
		if(stockCardRank!=0 && stockCardRank+tableauCardRank==13)
			pyramid_addCombineMove(movePack, STOCK, 0, TABLEAU, i);

		// Waste+Tableau
		if(wasteCardRank!=0 && wasteCardRank+tableauCardRank==13)
			pyramid_addCombineMove(movePack, WASTE, 0, TABLEAU, i);

		// Tableau+Tableau
		for(j=0;j<28;j++)
		{
			if(i==j || tableauCardRanks[j]==0)
				continue;
		
			if(tableauCardRank+tableauCardRanks[j]==13)
				pyramid_addCombineMove(movePack, TABLEAU, i, TABLEAU, j);
		}
	}

	// Stock->Waste
	if(stockCardRank!=0)
		movePack_add(movePack, move_create(MOVE, STOCK, 0, -1, WASTE, 0, -1));

	if((gConfig.game->id==PYRAMIDEASY || gConfig.game->id==PYRAMIDRELAXEDEASY) && wasteCardRank!=0 && stockCardRank==0 && *(unsigned char *)board->gameState<2)
	{
		*(unsigned char *)board->gameState = (*(unsigned char *)board->gameState)+1;
		movePack_add(movePack, move_create(MOVEREVERSED, WASTE, 0, 0, STOCK, 0, -1));
	}

	return movePack;
}